

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

bool duckdb_yyjson::unsafe_yyjson_mut_equals(yyjson_mut_val *lhs,yyjson_mut_val *rhs)

{
  yyjson_mut_val *lhs_00;
  yyjson_mut_val *pyVar1;
  void *__s2;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  byte bVar5;
  byte bVar6;
  yyjson_val_uni *pyVar7;
  ulong uVar8;
  yyjson_mut_val *cur;
  ulong *puVar9;
  yyjson_val_uni *pyVar10;
  ulong uVar11;
  ulong uVar12;
  ulong local_38;
  
  uVar8 = lhs->tag;
  bVar5 = (byte)uVar8 & 7;
  uVar11 = rhs->tag;
  if (bVar5 == ((byte)uVar11 & 7)) {
    switch(bVar5) {
    case 0:
      break;
    default:
      if (uVar8 >> 8 == uVar11 >> 8) {
        iVar3 = bcmp((lhs->uni).ptr,(rhs->uni).ptr,uVar8 >> 8);
        return iVar3 == 0;
      }
      break;
    case 2:
    case 3:
      return uVar8 == uVar11;
    case 4:
      bVar6 = (byte)uVar8 & 0x18;
      bVar5 = (byte)uVar11 & 0x18;
      if (bVar6 == bVar5) {
        uVar4 = (lhs->uni).u64;
LAB_0121f761:
        return uVar4 == (rhs->uni).u64;
      }
      if (bVar6 == 8 && (uVar11 & 0x18) == 0) {
        uVar4 = (lhs->uni).i64;
        if (-1 < (long)uVar4) goto LAB_0121f761;
      }
      else if (((uVar8 & 0x18) == 0 && bVar5 == 8) && (-1 < (rhs->uni).i64)) {
        return (lhs->uni).u64 == (rhs->uni).i64;
      }
      break;
    case 6:
      uVar12 = uVar8 >> 8;
      if (uVar12 == uVar11 >> 8) {
        if (uVar8 < 0x100) {
          return true;
        }
        pyVar10 = &rhs->uni;
        pyVar7 = &lhs->uni;
        do {
          uVar12 = uVar12 - 1;
          pyVar1 = (yyjson_mut_val *)pyVar10->str;
          lhs_00 = (yyjson_mut_val *)pyVar7->str;
          bVar2 = unsafe_yyjson_mut_equals(lhs_00,pyVar1);
          if (!bVar2) {
            return bVar2;
          }
          pyVar7 = (yyjson_val_uni *)&lhs_00->next;
          pyVar10 = (yyjson_val_uni *)&pyVar1->next;
        } while (uVar12 != 0);
        return bVar2;
      }
      break;
    case 7:
      uVar12 = uVar8 >> 8;
      if (uVar12 == uVar11 >> 8) {
        if (0xff < uVar8) {
          local_38 = 0;
          puVar9 = (ulong *)0x0;
          if (0xff < uVar11) {
            puVar9 = (ulong *)(rhs->uni).u64;
            local_38 = uVar12;
          }
          pyVar7 = &lhs->uni;
          do {
            pyVar1 = (yyjson_mut_val *)pyVar7->str;
            __s2 = (pyVar1->uni).ptr;
            if (__s2 == (void *)0x0) {
              return false;
            }
            if (local_38 == 0) {
              return false;
            }
            uVar12 = uVar12 - 1;
            uVar11 = pyVar1->tag >> 8;
            uVar8 = local_38;
            while ((puVar9 = *(ulong **)(puVar9[2] + 0x10), *puVar9 >> 8 != uVar11 ||
                   (iVar3 = bcmp((void *)puVar9[1],__s2,uVar11), iVar3 != 0))) {
              uVar8 = uVar8 - 1;
              if (uVar8 == 0) {
                return false;
              }
            }
            if ((yyjson_mut_val *)puVar9[2] == (yyjson_mut_val *)0x0) {
              return false;
            }
            pyVar1 = pyVar1->next;
            bVar2 = unsafe_yyjson_mut_equals(pyVar1,(yyjson_mut_val *)puVar9[2]);
            if (!bVar2) {
              return false;
            }
            pyVar7 = (yyjson_val_uni *)&pyVar1->next;
          } while (uVar12 != 0);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool unsafe_yyjson_mut_equals(yyjson_mut_val *lhs, yyjson_mut_val *rhs) {
    yyjson_type type = unsafe_yyjson_get_type(lhs);
    if (type != unsafe_yyjson_get_type(rhs)) return false;

    switch (type) {
        case YYJSON_TYPE_OBJ: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                yyjson_mut_obj_iter iter;
                yyjson_mut_obj_iter_init(rhs, &iter);
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                while (len-- > 0) {
                    rhs = yyjson_mut_obj_iter_getn(&iter, lhs->uni.str,
                                                   unsafe_yyjson_get_len(lhs));
                    if (!rhs) return false;
                    if (!unsafe_yyjson_mut_equals(lhs->next, rhs)) return false;
                    lhs = lhs->next->next;
                }
            }
            /* yyjson allows duplicate keys, so the check may be inaccurate */
            return true;
        }

        case YYJSON_TYPE_ARR: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                rhs = (yyjson_mut_val *)rhs->uni.ptr;
                while (len-- > 0) {
                    if (!unsafe_yyjson_mut_equals(lhs, rhs)) return false;
                    lhs = lhs->next;
                    rhs = rhs->next;
                }
            }
            return true;
        }

        case YYJSON_TYPE_NUM:
            return unsafe_yyjson_num_equals(lhs, rhs);

        case YYJSON_TYPE_RAW:
        case YYJSON_TYPE_STR:
            return unsafe_yyjson_str_equals(lhs, rhs);

        case YYJSON_TYPE_NULL:
        case YYJSON_TYPE_BOOL:
            return lhs->tag == rhs->tag;

        default:
            return false;
    }
}